

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O0

void Abc_TruthStoreRead(char *pFileName,Rpo_TtStore_t *p)

{
  char *__ptr;
  long lVar1;
  int iVar2;
  int iVar3;
  int local_28;
  int local_24;
  int nLines;
  int i;
  char *pContents;
  Rpo_TtStore_t *p_local;
  char *pFileName_local;
  
  __ptr = Abc_FileRead(pFileName);
  if (__ptr != (char *)0x0) {
    local_24 = 0;
    local_28 = 0;
    while (__ptr[local_24] != '\n') {
      iVar2 = local_28 + 1;
      Abc_TruthReadHex(p->pFuncs[local_28],__ptr + local_24,p->nVars);
      do {
        iVar3 = local_24 + 1;
        lVar1 = (long)local_24;
        local_28 = iVar2;
        local_24 = iVar3;
      } while (__ptr[lVar1] != '\n');
    }
    if (p->nFuncs < local_28) {
      __assert_fail("p->nFuncs >= nLines",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRpo.c"
                    ,0x101,"void Abc_TruthStoreRead(char *, Rpo_TtStore_t *)");
    }
    p->nFuncs = local_28;
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void Abc_TruthStoreRead(char * pFileName, Rpo_TtStore_t * p) {
    char * pContents;
    int i, nLines;
    pContents = Abc_FileRead(pFileName);
    if (pContents == NULL)
        return;
    // here it is assumed (without checking!) that each line of the file 
    // begins with a string of hexadecimal chars followed by space

    // the file will be read till the first empty line (pContents[i] == '\n')
    // (note that Abc_FileRead() added several empty lines at the end of the file contents)
    for (nLines = i = 0; pContents[i] != '\n';) {
        // read one line
        Abc_TruthReadHex(p->pFuncs[nLines++], &pContents[i], p->nVars);
        // skip till after the end-of-line symbol
        // (note that end-of-line symbol is also skipped)
        while (pContents[i++] != '\n');
    }
    // adjust the number of functions read 
    // (we may have allocated more storage because some lines in the file were empty)
    assert(p->nFuncs >= nLines);
    p->nFuncs = nLines;
    ABC_FREE(pContents);
}